

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::PathTypeHandlerWithAttr::GetProperty
          (PathTypeHandlerWithAttr *this,DynamicObject *instance,Var originalInstance,
          PropertyId propertyId,Var *value,PropertyValueInfo *info,ScriptContext *requestContext)

{
  ObjectSlotAttributes attributes;
  PropertyIndex index;
  BOOL BVar1;
  Var pvVar2;
  RecyclableObject *function;
  
  index = TypePath::LookupInline
                    ((this->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.typePath.ptr,
                     propertyId,
                     (uint)((this->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
                            super_DynamicTypeHandler.unusedBytes >> 1));
  if (index != 0xffff) {
    attributes = (this->attributes).ptr[index];
    BVar1 = 0;
    if ((attributes & ObjectSlotAttr_Deleted) == ObjectSlotAttr_None) {
      if ((attributes & ObjectSlotAttr_Accessor) == ObjectSlotAttr_None) {
        pvVar2 = DynamicObject::GetSlot(instance,(uint)index);
        *value = pvVar2;
        PathTypeHandlerBase::SetPropertyValueInfo
                  ((PathTypeHandlerBase *)this,info,&instance->super_RecyclableObject,index,
                   attributes);
      }
      else {
        if (info == (PropertyValueInfo *)0x0) {
          CacheOperators::CachePropertyReadForGetter
                    ((PropertyValueInfo *)0x0,originalInstance,propertyId,requestContext);
        }
        else {
          info->m_instance = &instance->super_RecyclableObject;
          info->m_propertyIndex = index;
          info->m_attributes = attributes & ObjectSlotAttr_PropertyAttributesMask;
          info->flags = InlineCacheNoFlags;
          CacheOperators::CachePropertyReadForGetter
                    (info,originalInstance,propertyId,requestContext);
          info->m_instance = &instance->super_RecyclableObject;
          info->m_propertyIndex = 0xffff;
          info->m_attributes = '\0';
          info->flags = InlineCacheNoFlags;
        }
        pvVar2 = DynamicObject::GetSlot(instance,(uint)index);
        function = UnsafeVarTo<Js::RecyclableObject>(pvVar2);
        pvVar2 = JavascriptOperators::CallGetter(function,originalInstance,requestContext);
        *value = pvVar2;
      }
      BVar1 = 1;
    }
    return BVar1;
  }
  BVar1 = PathTypeHandlerBase::GetProperty
                    ((PathTypeHandlerBase *)this,instance,originalInstance,propertyId,value,info,
                     requestContext);
  return BVar1;
}

Assistant:

BOOL PathTypeHandlerWithAttr::GetProperty(DynamicObject* instance, Var originalInstance, PropertyId propertyId, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        PropertyIndex index = GetTypePath()->LookupInline(propertyId, GetPathLength());
        if (index == Constants::NoSlot)
        {
            return __super::GetProperty(instance, originalInstance, propertyId, value, info, requestContext);
        }

        ObjectSlotAttributes attr = attributes[index];
        if (attr & ObjectSlotAttr_Deleted)
        {
            return false;
        }

        if (attr & ObjectSlotAttr_Accessor)
        {
            // We must update cache before calling a getter, because it can invalidate something. Bug# 593815
            PropertyValueInfo::Set(info, instance, index, ObjectSlotAttributesToPropertyAttributes(attr));
            CacheOperators::CachePropertyReadForGetter(info, originalInstance, propertyId, requestContext);
            PropertyValueInfo::SetNoCache(info, instance); // we already cached getter, so we don't have to do it once more

            RecyclableObject* func = UnsafeVarTo<RecyclableObject>(instance->GetSlot(index));
            *value = JavascriptOperators::CallGetter(func, originalInstance, requestContext);
            return true;
        }

        *value = instance->GetSlot(index);
        this->SetPropertyValueInfo(info, instance, index, attr);
        return true;
    }